

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_4x2(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  undefined1 auVar13 [16];
  long lVar14;
  undefined1 auVar15 [16];
  
  lVar12 = 0;
  memset(data,0,0x100);
  uVar6 = (ulong)start_col;
  do {
    lVar7 = *(long *)((long)sample_data + lVar12);
    bVar3 = *(byte *)(lVar7 + 3 + uVar6);
    iVar10 = (uint)*(byte *)(lVar7 + uVar6) + (uint)bVar3;
    bVar4 = *(byte *)(lVar7 + 1 + uVar6);
    bVar5 = *(byte *)(lVar7 + 2 + uVar6);
    iVar11 = (uint)bVar4 + (uint)bVar5;
    lVar8 = (ulong)*(byte *)(lVar7 + uVar6) - (ulong)bVar3;
    lVar7 = (ulong)bVar4 - (ulong)bVar5;
    data[lVar12] = (iVar11 + iVar10) * 0x20 + -0x4000;
    data[lVar12 + 2] = (iVar10 - iVar11) * 0x20;
    lVar9 = (lVar7 + lVar8) * 0x1151;
    data[lVar12 + 1] = (DCTELEM)((ulong)(lVar8 * 0x187e + lVar9 + 0x80) >> 8);
    data[lVar12 + 3] = (DCTELEM)((ulong)(lVar7 * 0xffffffc4df + lVar9 + 0x80) >> 8);
    lVar12 = lVar12 + 8;
  } while (lVar12 == 8);
  auVar1 = *(undefined1 (*) [16])data;
  auVar2 = *(undefined1 (*) [16])(data + 8);
  auVar13._0_8_ = auVar1._0_8_;
  auVar13._8_4_ = auVar1._4_4_;
  auVar13._12_4_ = -(uint)(auVar1._4_4_ < 0);
  lVar8 = CONCAT44(-(uint)(auVar1._0_4_ < 0),auVar1._0_4_) + 2;
  lVar9 = auVar13._8_8_ + 2;
  lVar12 = CONCAT44(-(uint)(auVar1._8_4_ < 0),auVar1._8_4_) + 2;
  lVar7 = CONCAT44(-(uint)(auVar1._12_4_ < 0),auVar1._12_4_) + 2;
  iVar10 = auVar2._8_4_;
  iVar11 = auVar2._12_4_;
  auVar15._0_8_ = auVar2._0_8_;
  auVar15._8_4_ = auVar2._4_4_;
  auVar15._12_4_ = -(uint)(auVar2._4_4_ < 0);
  lVar14 = CONCAT44(-(uint)(auVar2._0_4_ < 0),auVar2._0_4_);
  auVar1._8_4_ = (int)lVar7;
  auVar1._0_8_ = lVar12;
  auVar1._12_4_ = (int)((ulong)lVar7 >> 0x20);
  *data = (DCTELEM)((ulong)(lVar8 + lVar14) >> 2);
  data[1] = (DCTELEM)((ulong)(lVar9 + auVar15._8_8_) >> 2);
  data[2] = (DCTELEM)((ulong)(lVar12 + CONCAT44(-(uint)(iVar10 < 0),iVar10)) >> 2);
  data[3] = (DCTELEM)((ulong)(auVar1._8_8_ + CONCAT44(-(uint)(iVar11 < 0),iVar11)) >> 2);
  data[8] = (DCTELEM)((ulong)(lVar8 - lVar14) >> 2);
  data[9] = (DCTELEM)((ulong)(lVar9 - auVar15._8_8_) >> 2);
  data[10] = (DCTELEM)((ulong)(lVar12 - CONCAT44(-(uint)(iVar10 < 0),iVar10)) >> 2);
  data[0xb] = (DCTELEM)((ulong)(lVar7 - CONCAT44(-(uint)(iVar11 < 0),iVar11)) >> 2);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_4x2 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1;
  INT32 tmp10, tmp11;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We must also scale the output by (8/4)*(8/2) = 2**3, which we add here. */
  /* 4-point FDCT kernel, */
  /* cK represents sqrt(2) * cos(K*pi/16) [refers to 8-point FDCT]. */

  dataptr = data;
  for (ctr = 0; ctr < 2; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[3]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[2]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[3]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 4 * CENTERJSAMPLE) << (PASS1_BITS+3));
    dataptr[2] = (DCTELEM) ((tmp0 - tmp1) << (PASS1_BITS+3));

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-4);

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS-PASS1_BITS-3);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS-PASS1_BITS-3);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = dataptr[DCTSIZE*0] + (ONE << (PASS1_BITS-1));
    tmp1 = dataptr[DCTSIZE*1];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp0 + tmp1, PASS1_BITS);

    /* Odd part */

    dataptr[DCTSIZE*1] = (DCTELEM) RIGHT_SHIFT(tmp0 - tmp1, PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}